

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double incircle(double *pa,double *pb,double *pc,double *pd)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int elen;
  uint uVar14;
  ulong uVar15;
  double *pdVar16;
  double *pdVar17;
  double b;
  double dVar18;
  double dVar19;
  double dVar20;
  double b_00;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double b_01;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double b_02;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double *pdStack_6658;
  double *pdStack_6640;
  double *pdStack_6638;
  double *pdStack_6618;
  int iStack_65b8;
  double *pdStack_65a8;
  int iStack_6578;
  int iStack_6528;
  double dStack_6468;
  double dStack_6460;
  double dStack_6458;
  double dStack_6450;
  double dStack_6448;
  double dStack_6440;
  double dStack_6438;
  double dStack_6430;
  double dStack_6428;
  double dStack_6420;
  double dStack_6418;
  double dStack_6410;
  double dStack_6408;
  undefined8 uStack_6400;
  double dStack_63f0;
  double adStack_63e8 [16];
  double dStack_6368;
  double dStack_6360;
  double dStack_6358;
  double dStack_6350;
  double dStack_6348;
  double dStack_6340;
  double dStack_6338;
  double dStack_6330;
  double dStack_6328;
  double dStack_6320;
  double dStack_6318;
  double dStack_6310;
  double adStack_6308 [16];
  double dStack_6288;
  undefined8 uStack_6280;
  double dStack_6278;
  undefined8 uStack_6270;
  double dStack_6268;
  undefined8 uStack_6260;
  double adStack_6258 [8];
  double dStack_6218;
  double dStack_6210;
  double dStack_6208;
  double dStack_6200;
  double dStack_61f8;
  double dStack_61f0;
  double dStack_61e8;
  double dStack_61e0;
  double dStack_61d8;
  double dStack_61d0;
  double dStack_61c8;
  double dStack_61c0;
  double dStack_61b8;
  double dStack_61b0;
  double dStack_61a8;
  double dStack_61a0;
  double dStack_6198;
  double dStack_6190;
  double dStack_6188;
  double dStack_6180;
  double adStack_6178 [32];
  double adStack_6078 [8];
  double adStack_6038 [8];
  double adStack_5ff8 [8];
  double adStack_5fb8 [16];
  double adStack_5f38 [8];
  double adStack_5ef8 [8];
  double adStack_5eb8 [8];
  double adStack_5e78 [8];
  double adStack_5e38 [8];
  double adStack_5df8 [8];
  double adStack_5db8 [48];
  double adStack_5c38 [32];
  double adStack_5b38 [8];
  double adStack_5af8 [8];
  double adStack_5ab8 [8];
  double adStack_5a78 [8];
  double adStack_5a38 [8];
  double adStack_59f8 [8];
  double adStack_59b8 [16];
  double adStack_5938 [16];
  double adStack_58b8 [16];
  double adStack_5838 [8];
  double adStack_57f8 [8];
  double adStack_57b8 [8];
  double adStack_5778 [8];
  double adStack_5738 [8];
  double adStack_56f8 [8];
  double adStack_56b8 [8];
  double adStack_5678 [8];
  double adStack_5638 [8];
  double adStack_55f8 [8];
  double adStack_55b8 [8];
  double adStack_5578 [8];
  double adStack_5538 [8];
  double adStack_54f8 [8];
  double adStack_54b8 [8];
  double adStack_5478 [8];
  double adStack_5438 [8];
  double adStack_53f8 [8];
  double adStack_53b8 [64];
  double adStack_51b8 [16];
  double adStack_5138 [16];
  double adStack_50b8 [16];
  double adStack_5038 [16];
  double adStack_4fb8 [16];
  double adStack_4f38 [16];
  double adStack_4eb8 [16];
  double adStack_4e38 [32];
  double adStack_4d38 [16];
  double adStack_4cb8 [16];
  double adStack_4c38 [32];
  double adStack_4b38 [32];
  double adStack_4a38 [64];
  double adStack_4838 [1152];
  double adStack_2438 [1153];
  
  dVar18 = splitter;
  dVar30 = *pd;
  dVar19 = pd[1];
  dVar25 = *pa - dVar30;
  dVar46 = *pb - dVar30;
  dVar30 = *pc - dVar30;
  dVar39 = pa[1] - dVar19;
  dVar42 = pb[1] - dVar19;
  dVar19 = pc[1] - dVar19;
  dVar43 = dVar25 * dVar25 + dVar39 * dVar39;
  dVar40 = dVar46 * dVar46 + dVar42 * dVar42;
  dVar31 = dVar30 * dVar30 + dVar19 * dVar19;
  dVar20 = (dVar25 * dVar42 - dVar39 * dVar46) * dVar31 +
           (dVar46 * dVar19 - dVar30 * dVar42) * dVar43 +
           (dVar30 * dVar39 - dVar25 * dVar19) * dVar40;
  dVar30 = (ABS(dVar39 * dVar46) + ABS(dVar25 * dVar42)) * dVar31 +
           (ABS(dVar30 * dVar42) + ABS(dVar46 * dVar19)) * dVar43 +
           (ABS(dVar25 * dVar19) + ABS(dVar30 * dVar39)) * dVar40;
  if ((dVar20 <= iccerrboundA * dVar30) && (-dVar20 <= iccerrboundA * dVar30)) {
    dVar19 = *pd;
    dVar39 = pd[1];
    dVar20 = *pb;
    b_01 = dVar20 - dVar19;
    dVar25 = *pc;
    dVar31 = pc[1];
    b = dVar31 - dVar39;
    dVar41 = b_01 * b;
    dVar32 = b_01 * splitter - (b_01 * splitter - b_01);
    dVar36 = b_01 - dVar32;
    dVar26 = splitter * b - (splitter * b - b);
    dVar38 = b - dVar26;
    dVar42 = dVar36 * dVar38 - (((dVar41 - dVar32 * dVar26) - dVar36 * dVar26) - dVar32 * dVar38);
    b_00 = dVar25 - dVar19;
    dVar33 = b_00 * splitter - (b_00 * splitter - b_00);
    dVar40 = pb[1];
    dVar21 = dVar40 - dVar39;
    dVar34 = dVar21 * splitter - (dVar21 * splitter - dVar21);
    dStack_6408 = b_00 * dVar21;
    dVar27 = b_00 - dVar33;
    dVar28 = dVar21 - dVar34;
    dVar43 = dVar27 * dVar28 -
             (((dStack_6408 - dVar33 * dVar34) - dVar27 * dVar34) - dVar33 * dVar28);
    dVar22 = dVar42 - dVar43;
    dStack_6198 = (dVar42 - (dVar22 + (dVar42 - dVar22))) + ((dVar42 - dVar22) - dVar43);
    dVar42 = *pa;
    dVar43 = pa[1];
    dVar46 = dVar41 + dVar22;
    dVar22 = (dVar41 - (dVar46 - (dVar46 - dVar41))) + (dVar22 - (dVar46 - dVar41));
    dVar23 = dVar22 - dStack_6408;
    uStack_6400 = 0;
    dStack_6190 = (dVar22 - (dVar23 + (dVar22 - dVar23))) + ((dVar22 - dVar23) - dStack_6408);
    dStack_6180 = dVar46 + dVar23;
    dStack_6188 = (dVar46 - (dStack_6180 - (dStack_6180 - dVar46))) +
                  (dVar23 - (dStack_6180 - dVar46));
    dVar46 = dVar42 - dVar19;
    b_02 = dVar43 - dVar39;
    iVar6 = scale_expansion_zeroelim(4,&dStack_6198,dVar46,adStack_53f8);
    iVar6 = scale_expansion_zeroelim(iVar6,adStack_53f8,dVar46,adStack_4cb8);
    iVar7 = scale_expansion_zeroelim(4,&dStack_6198,b_02,adStack_5438);
    iVar7 = scale_expansion_zeroelim(iVar7,adStack_5438,b_02,adStack_4d38);
    iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_4cb8,iVar7,adStack_4d38,adStack_4e38);
    dVar35 = b_00 * b_02;
    dVar24 = b_02 * dVar18;
    dVar24 = dVar24 - (dVar24 - b_02);
    dVar29 = b_02 - dVar24;
    dVar33 = dVar27 * dVar29 - (((dVar35 - dVar33 * dVar24) - dVar27 * dVar24) - dVar33 * dVar29);
    dVar37 = dVar46 * b;
    dVar18 = dVar18 * dVar46;
    dVar18 = dVar18 - (dVar18 - dVar46);
    dVar27 = dVar46 - dVar18;
    dVar22 = dVar38 * dVar27 - (((dVar37 - dVar18 * dVar26) - dVar26 * dVar27) - dVar18 * dVar38);
    dVar23 = dVar33 - dVar22;
    dStack_61b8 = (dVar33 - (dVar23 + (dVar33 - dVar23))) + ((dVar33 - dVar23) - dVar22);
    dVar22 = dVar35 + dVar23;
    dVar26 = (dVar35 - (dVar22 - (dVar22 - dVar35))) + (dVar23 - (dVar22 - dVar35));
    dVar23 = dVar26 - dVar37;
    dStack_61b0 = (dVar26 - (dVar23 + (dVar26 - dVar23))) + ((dVar26 - dVar23) - dVar37);
    dStack_61a0 = dVar22 + dVar23;
    dStack_61a8 = (dVar22 - (dStack_61a0 - (dStack_61a0 - dVar22))) +
                  (dVar23 - (dStack_61a0 - dVar22));
    iVar7 = scale_expansion_zeroelim(4,&dStack_61b8,b_01,adStack_5478);
    iVar7 = scale_expansion_zeroelim(iVar7,adStack_5478,b_01,adStack_4eb8);
    iVar8 = scale_expansion_zeroelim(4,&dStack_61b8,dVar21,adStack_54b8);
    iVar8 = scale_expansion_zeroelim(iVar8,adStack_54b8,dVar21,adStack_4f38);
    iVar7 = fast_expansion_sum_zeroelim(iVar7,adStack_4eb8,iVar8,adStack_4f38,adStack_4b38);
    dVar33 = dVar46 * dVar21;
    dVar26 = dVar28 * dVar27 - (((dVar33 - dVar18 * dVar34) - dVar34 * dVar27) - dVar18 * dVar28);
    dVar28 = b_01 * b_02;
    dVar22 = dVar36 * dVar29 - (((dVar28 - dVar32 * dVar24) - dVar36 * dVar24) - dVar32 * dVar29);
    dVar23 = dVar26 - dVar22;
    dStack_61d8 = (dVar26 - (dVar23 + (dVar26 - dVar23))) + ((dVar26 - dVar23) - dVar22);
    dVar22 = dVar33 + dVar23;
    dVar26 = (dVar33 - (dVar22 - (dVar22 - dVar33))) + (dVar23 - (dVar22 - dVar33));
    dVar23 = dVar26 - dVar28;
    dStack_61d0 = (dVar26 - (dVar23 + (dVar26 - dVar23))) + ((dVar26 - dVar23) - dVar28);
    dStack_61c0 = dVar22 + dVar23;
    dStack_61c8 = (dVar22 - (dStack_61c0 - (dStack_61c0 - dVar22))) +
                  (dVar23 - (dStack_61c0 - dVar22));
    iVar8 = scale_expansion_zeroelim(4,&dStack_61d8,b_00,adStack_54f8);
    iVar8 = scale_expansion_zeroelim(iVar8,adStack_54f8,b_00,adStack_4fb8);
    iVar9 = scale_expansion_zeroelim(4,&dStack_61d8,b,adStack_5538);
    iVar9 = scale_expansion_zeroelim(iVar9,adStack_5538,b,adStack_5038);
    iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_4fb8,iVar9,adStack_5038,adStack_4c38);
    iVar6 = fast_expansion_sum_zeroelim(iVar6,adStack_4e38,iVar7,adStack_4b38,adStack_4a38);
    pdVar16 = adStack_4838;
    pdStack_6638._0_4_ = fast_expansion_sum_zeroelim(iVar6,adStack_4a38,iVar8,adStack_4c38,pdVar16);
    if (1 < (int)(uint)pdStack_6638) {
      uVar15 = 1;
      do {
        adStack_4838[0] = adStack_4838[0] + adStack_4838[uVar15];
        uVar15 = uVar15 + 1;
      } while ((uint)pdStack_6638 != uVar15);
    }
    uStack_6260 = 0;
    if ((adStack_4838[0] < iccerrboundB * dVar30) && (-adStack_4838[0] < iccerrboundB * dVar30)) {
      dVar42 = (dVar42 - (dVar46 + (dVar42 - dVar46))) + ((dVar42 - dVar46) - dVar19);
      dVar43 = (dVar43 - (b_02 + (dVar43 - b_02))) + ((dVar43 - b_02) - dVar39);
      dVar20 = (dVar20 - (b_01 + (dVar20 - b_01))) + ((dVar20 - b_01) - dVar19);
      dVar40 = (dVar40 - (dVar21 + (dVar40 - dVar21))) + ((dVar40 - dVar21) - dVar39);
      dVar25 = (dVar25 - (b_00 + (dVar25 - b_00))) + ((dVar25 - b_00) - dVar19);
      dVar19 = (dVar31 - (b + (dVar31 - b))) + ((dVar31 - b) - dVar39);
      if ((((dVar42 != 0.0) ||
           ((((NAN(dVar42) || (dVar20 != 0.0)) || (NAN(dVar20))) ||
            ((dVar25 != 0.0 || (NAN(dVar25))))))) || (dVar43 != 0.0)) ||
         (((NAN(dVar43) || (dVar40 != 0.0)) || ((NAN(dVar40) || ((dVar19 != 0.0 || (NAN(dVar19))))))
          ))) {
        dVar32 = dVar30 * iccerrboundC + ABS(adStack_4838[0]) * resulterrbound;
        dVar31 = b_02 * b_02;
        dVar30 = dVar46 * dVar46;
        dVar34 = dVar20 * b;
        dVar22 = b_01 * dVar19;
        dVar36 = dVar46 * dVar42 + b_02 * dVar43;
        dVar41 = dVar41 - dStack_6408;
        dVar23 = dVar21 * dVar21;
        dVar39 = b_01 * b_01;
        dVar45 = b_02 * dVar25;
        dStack_6408 = b_00 * dVar43;
        uStack_6400 = 0;
        dVar38 = b_01 * dVar20 + dVar21 * dVar40;
        dVar48 = b * b;
        dStack_6268 = dVar42 * dVar21;
        dVar47 = dVar46 * dVar40;
        dVar26 = b_00 * b_00;
        dVar44 = b_00 * dVar25 + b * dVar19;
        adStack_4838[0] =
             (dVar33 - dVar28) * (dVar44 + dVar44) +
             ((dVar47 + dStack_6268) - (b_02 * dVar20 + b_01 * dVar43)) * (dVar26 + dVar48) +
             (dVar35 - dVar37) * (dVar38 + dVar38) +
             ((dStack_6408 + dVar45) - (b * dVar42 + dVar46 * dVar19)) * (dVar39 + dVar23) +
             dVar41 * (dVar36 + dVar36) +
             ((dVar22 + dVar34) - (dVar21 * dVar25 + b_00 * dVar40)) * (dVar30 + dVar31) +
             adStack_4838[0];
        if ((adStack_4838[0] < dVar32) && (-adStack_4838[0] < dVar32)) {
          bVar1 = dVar40 != 0.0;
          bVar2 = dVar20 != 0.0;
          if ((dVar19 != 0.0 || dVar25 != 0.0) || (bVar1 || bVar2)) {
            dVar27 = dVar27 * dVar27 - ((-dVar18 * dVar18 + dVar30) - (dVar18 + dVar18) * dVar27);
            dVar18 = dVar29 * dVar29 - ((dVar31 - dVar24 * dVar24) - (dVar24 + dVar24) * dVar29);
            dVar24 = dVar27 + dVar18;
            dStack_6428 = ((dVar24 - dVar27) - dVar24) + dVar27 + (dVar18 - (dVar24 - dVar27));
            dVar18 = dVar30 + dVar24;
            dVar24 = ((dVar18 - dVar30) - dVar18) + dVar30 + (dVar24 - (dVar18 - dVar30));
            dVar30 = dVar31 + dVar24;
            dStack_6420 = ((dVar30 - dVar24) - dVar30) + dVar24 + (dVar31 - (dVar30 - dVar24));
            dStack_6410 = dVar18 + dVar30;
            dStack_6418 = ((dStack_6410 - dVar18) - dStack_6410) + dVar18 +
                          (dVar30 - (dStack_6410 - dVar18));
          }
          bVar5 = dVar19 != 0.0 || dVar25 != 0.0;
          if ((dVar43 != 0.0 || dVar42 != 0.0) || bVar5) {
            dVar18 = b_01 * splitter - (b_01 * splitter - b_01);
            dVar30 = b_01 - dVar18;
            dVar30 = dVar30 * dVar30 - ((dVar39 - dVar18 * dVar18) - (dVar18 + dVar18) * dVar30);
            dVar18 = splitter * dVar21 - (splitter * dVar21 - dVar21);
            dVar31 = dVar21 - dVar18;
            dVar18 = dVar31 * dVar31 - ((dVar23 - dVar18 * dVar18) - (dVar18 + dVar18) * dVar31);
            dVar31 = dVar30 + dVar18;
            dStack_6448 = ((dVar31 - dVar30) - dVar31) + dVar30 + (dVar18 - (dVar31 - dVar30));
            dVar18 = dVar39 + dVar31;
            dVar39 = ((dVar18 - dVar39) - dVar18) + dVar39 + (dVar31 - (dVar18 - dVar39));
            dVar30 = dVar23 + dVar39;
            dStack_6440 = ((dVar30 - dVar39) - dVar30) + dVar39 + (dVar23 - (dVar30 - dVar39));
            dStack_6430 = dVar18 + dVar30;
            dStack_6438 = ((dStack_6430 - dVar18) - dStack_6430) + dVar18 +
                          (dVar30 - (dStack_6430 - dVar18));
          }
          bVar3 = dVar43 != 0.0;
          bVar4 = dVar42 != 0.0;
          if ((dVar20 != 0.0 || dVar40 != 0.0) || (bVar3 || bVar4)) {
            dVar39 = b_00 * splitter - (b_00 * splitter - b_00);
            dVar30 = b_00 - dVar39;
            dVar30 = dVar30 * dVar30 - ((dVar26 - dVar39 * dVar39) - (dVar39 + dVar39) * dVar30);
            dVar39 = splitter * b - (splitter * b - b);
            dVar18 = b - dVar39;
            dVar39 = dVar18 * dVar18 - ((dVar48 - dVar39 * dVar39) - (dVar39 + dVar39) * dVar18);
            dVar18 = dVar30 + dVar39;
            dStack_6468 = ((dVar18 - dVar30) - dVar18) + dVar30 + (dVar39 - (dVar18 - dVar30));
            dVar39 = dVar26 + dVar18;
            dVar18 = ((dVar39 - dVar26) - dVar39) + dVar26 + (dVar18 - (dVar39 - dVar26));
            dVar30 = dVar48 + dVar18;
            dStack_6460 = ((dVar30 - dVar18) - dVar30) + dVar18 + (dVar48 - (dVar30 - dVar18));
            dStack_6450 = dVar39 + dVar30;
            dStack_6458 = ((dStack_6450 - dVar39) - dStack_6450) + dVar39 +
                          (dVar30 - (dStack_6450 - dVar39));
          }
          iVar6 = 0;
          if ((dVar42 != 0.0) || (NAN(dVar42))) {
            iVar7 = scale_expansion_zeroelim(4,&dStack_6198,dVar42,adStack_5df8);
            iVar8 = scale_expansion_zeroelim(iVar7,adStack_5df8,dVar46 + dVar46,adStack_63e8);
            iVar9 = scale_expansion_zeroelim(4,&dStack_6468,dVar42,adStack_55b8);
            iVar9 = scale_expansion_zeroelim(iVar9,adStack_55b8,dVar21,adStack_6308);
            iVar10 = scale_expansion_zeroelim(4,&dStack_6448,dVar42,adStack_5578);
            iVar10 = scale_expansion_zeroelim(iVar10,adStack_5578,-b,adStack_5fb8);
            iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_63e8,iVar9,adStack_6308,adStack_6178);
            iVar8 = fast_expansion_sum_zeroelim(iVar10,adStack_5fb8,iVar8,adStack_6178,adStack_5db8)
            ;
            pdStack_6640 = adStack_4838;
            pdVar16 = adStack_2438;
            pdStack_6638._0_4_ =
                 fast_expansion_sum_zeroelim
                           ((uint)pdStack_6638,pdStack_6640,iVar8,adStack_5db8,pdVar16);
          }
          else {
            pdStack_6640 = adStack_2438;
            iVar7 = 0;
          }
          if ((dVar43 != 0.0) || (pdVar17 = pdVar16, NAN(dVar43))) {
            iVar6 = scale_expansion_zeroelim(4,&dStack_6198,dVar43,adStack_5e38);
            iVar8 = scale_expansion_zeroelim(iVar6,adStack_5e38,b_02 + b_02,adStack_63e8);
            iVar9 = scale_expansion_zeroelim(4,&dStack_6448,dVar43,adStack_55f8);
            iVar9 = scale_expansion_zeroelim(iVar9,adStack_55f8,b_00,adStack_6308);
            iVar10 = scale_expansion_zeroelim(4,&dStack_6468,dVar43,adStack_5638);
            iVar10 = scale_expansion_zeroelim(iVar10,adStack_5638,-b_01,adStack_5fb8);
            iVar8 = fast_expansion_sum_zeroelim(iVar8,adStack_63e8,iVar9,adStack_6308,adStack_6178);
            iVar8 = fast_expansion_sum_zeroelim(iVar10,adStack_5fb8,iVar8,adStack_6178,adStack_5db8)
            ;
            pdStack_6638._0_4_ =
                 fast_expansion_sum_zeroelim
                           ((uint)pdStack_6638,pdVar16,iVar8,adStack_5db8,pdStack_6640);
            pdVar17 = pdStack_6640;
            pdStack_6640 = pdVar16;
          }
          iVar8 = 0;
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            iStack_6528 = scale_expansion_zeroelim(4,&dStack_61b8,dVar20,adStack_5e78);
            iVar9 = scale_expansion_zeroelim(iStack_6528,adStack_5e78,b_01 + b_01,adStack_63e8);
            iVar10 = scale_expansion_zeroelim(4,&dStack_6428,dVar20,adStack_5678);
            iVar10 = scale_expansion_zeroelim(iVar10,adStack_5678,b,adStack_6308);
            iVar11 = scale_expansion_zeroelim(4,&dStack_6468,dVar20,adStack_56b8);
            iVar11 = scale_expansion_zeroelim(iVar11,adStack_56b8,-b_02,adStack_5fb8);
            iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_63e8,iVar10,adStack_6308,adStack_6178)
            ;
            iVar9 = fast_expansion_sum_zeroelim(iVar11,adStack_5fb8,iVar9,adStack_6178,adStack_5db8)
            ;
            pdStack_6638._0_4_ =
                 fast_expansion_sum_zeroelim
                           ((uint)pdStack_6638,pdVar17,iVar9,adStack_5db8,pdStack_6640);
            pdVar16 = pdStack_6640;
            pdStack_6640 = pdVar17;
          }
          else {
            iStack_6528 = 0;
            pdVar16 = pdVar17;
          }
          if ((dVar40 != 0.0) || (pdVar17 = pdVar16, NAN(dVar40))) {
            iVar8 = scale_expansion_zeroelim(4,&dStack_61b8,dVar40,adStack_5eb8);
            iVar9 = scale_expansion_zeroelim(iVar8,adStack_5eb8,dVar21 + dVar21,adStack_63e8);
            iVar10 = scale_expansion_zeroelim(4,&dStack_6468,dVar40,adStack_5738);
            iVar10 = scale_expansion_zeroelim(iVar10,adStack_5738,dVar46,adStack_6308);
            iVar11 = scale_expansion_zeroelim(4,&dStack_6428,dVar40,adStack_56f8);
            iVar11 = scale_expansion_zeroelim(iVar11,adStack_56f8,-b_00,adStack_5fb8);
            iVar9 = fast_expansion_sum_zeroelim(iVar9,adStack_63e8,iVar10,adStack_6308,adStack_6178)
            ;
            iVar9 = fast_expansion_sum_zeroelim(iVar11,adStack_5fb8,iVar9,adStack_6178,adStack_5db8)
            ;
            pdStack_6638._0_4_ =
                 fast_expansion_sum_zeroelim
                           ((uint)pdStack_6638,pdVar16,iVar9,adStack_5db8,pdStack_6640);
            pdVar17 = pdStack_6640;
            pdStack_6640 = pdVar16;
          }
          iVar9 = 0;
          if ((dVar25 != 0.0) || (NAN(dVar25))) {
            iVar10 = scale_expansion_zeroelim(4,&dStack_61d8,dVar25,adStack_5ef8);
            iVar11 = scale_expansion_zeroelim(iVar10,adStack_5ef8,b_00 + b_00,adStack_63e8);
            iVar12 = scale_expansion_zeroelim(4,&dStack_6448,dVar25,adStack_57b8);
            iVar12 = scale_expansion_zeroelim(iVar12,adStack_57b8,b_02,adStack_6308);
            iVar13 = scale_expansion_zeroelim(4,&dStack_6428,dVar25,adStack_5778);
            iVar13 = scale_expansion_zeroelim(iVar13,adStack_5778,-dVar21,adStack_5fb8);
            iVar11 = fast_expansion_sum_zeroelim
                               (iVar11,adStack_63e8,iVar12,adStack_6308,adStack_6178);
            iVar11 = fast_expansion_sum_zeroelim
                               (iVar13,adStack_5fb8,iVar11,adStack_6178,adStack_5db8);
            pdStack_6638._0_4_ =
                 fast_expansion_sum_zeroelim
                           ((uint)pdStack_6638,pdVar17,iVar11,adStack_5db8,pdStack_6640);
            pdVar16 = pdStack_6640;
            pdStack_6640 = pdVar17;
          }
          else {
            iVar10 = 0;
            pdVar16 = pdVar17;
          }
          if ((dVar19 != 0.0) || (pdStack_6658 = pdVar16, NAN(dVar19))) {
            iVar9 = scale_expansion_zeroelim(4,&dStack_61d8,dVar19,adStack_5f38);
            iVar11 = scale_expansion_zeroelim(iVar9,adStack_5f38,b + b,adStack_63e8);
            iVar12 = scale_expansion_zeroelim(4,&dStack_6428,dVar19,adStack_57f8);
            iVar12 = scale_expansion_zeroelim(iVar12,adStack_57f8,b_01,adStack_6308);
            iVar13 = scale_expansion_zeroelim(4,&dStack_6448,dVar19,adStack_5838);
            iVar13 = scale_expansion_zeroelim(iVar13,adStack_5838,-dVar46,adStack_5fb8);
            iVar11 = fast_expansion_sum_zeroelim
                               (iVar11,adStack_63e8,iVar12,adStack_6308,adStack_6178);
            iVar11 = fast_expansion_sum_zeroelim
                               (iVar13,adStack_5fb8,iVar11,adStack_6178,adStack_5db8);
            pdStack_6638._0_4_ =
                 fast_expansion_sum_zeroelim
                           ((uint)pdStack_6638,pdVar16,iVar11,adStack_5db8,pdStack_6640);
            pdStack_6658 = pdStack_6640;
            pdStack_6640 = pdVar16;
          }
          if (bVar3 || bVar4) {
            if ((dVar19 != 0.0 || dVar25 != 0.0) || (bVar1 || bVar2)) {
              dVar39 = dVar20 * splitter - (dVar20 * splitter - dVar20);
              dVar28 = dVar20 - dVar39;
              dVar30 = b * splitter - (b * splitter - b);
              dVar30 = (b - dVar30) * dVar28 -
                       (((dVar34 - dVar39 * dVar30) - dVar30 * dVar28) - dVar39 * (b - dVar30));
              dVar18 = b_01 * splitter - (b_01 * splitter - b_01);
              dStack_6288 = dVar19 * splitter - (dVar19 * splitter - dVar19);
              uStack_6280 = 0;
              dStack_6278 = dVar19 - dStack_6288;
              uStack_6270 = 0;
              dVar18 = (b_01 - dVar18) * dStack_6278 -
                       (((dVar22 - dVar18 * dStack_6288) - (b_01 - dVar18) * dStack_6288) -
                       dVar18 * dStack_6278);
              dVar31 = dVar30 + dVar18;
              dStack_61f8 = (dVar30 - (dVar31 - (dVar31 - dVar30))) + (dVar18 - (dVar31 - dVar30));
              dVar30 = dVar34 + dVar31;
              dVar31 = (dVar34 - (dVar30 - (dVar30 - dVar34))) + (dVar31 - (dVar30 - dVar34));
              dVar18 = dVar22 + dVar31;
              dStack_61f0 = (dVar31 - (dVar18 - (dVar18 - dVar31))) + (dVar22 - (dVar18 - dVar31));
              dStack_61e0 = dVar30 + dVar18;
              dStack_61e8 = (dVar30 - (dStack_61e0 - (dStack_61e0 - dVar30))) +
                            (dVar18 - (dStack_61e0 - dVar30));
              dVar18 = -dVar21;
              dVar30 = dVar25 * dVar18;
              dVar26 = dVar25 * splitter - (dVar25 * splitter - dVar25);
              dVar27 = dVar25 - dVar26;
              dVar31 = splitter * dVar18 - (dVar21 + splitter * dVar18);
              dVar18 = (dVar18 - dVar31) * dVar27 -
                       (((dVar30 - dVar26 * dVar31) - dVar31 * dVar27) - dVar26 * (dVar18 - dVar31))
              ;
              dVar31 = -dVar40;
              dVar22 = b_00 * dVar31;
              dStack_63f0 = splitter;
              dVar23 = b_00 * splitter - (b_00 * splitter - b_00);
              dVar24 = splitter * dVar31 - (dVar40 + splitter * dVar31);
              dVar31 = (dVar31 - dVar24) * (b_00 - dVar23) -
                       (((dVar22 - dVar23 * dVar24) - dVar24 * (b_00 - dVar23)) -
                       dVar23 * (dVar31 - dVar24));
              dVar23 = dVar18 + dVar31;
              dStack_6218 = (dVar18 - (dVar23 - (dVar23 - dVar18))) + (dVar31 - (dVar23 - dVar18));
              dVar18 = dVar30 + dVar23;
              dVar30 = (dVar30 - (dVar18 - (dVar18 - dVar30))) + (dVar23 - (dVar18 - dVar30));
              dVar31 = dVar22 + dVar30;
              dStack_6210 = (dVar30 - (dVar31 - (dVar31 - dVar30))) + (dVar22 - (dVar31 - dVar30));
              dStack_6200 = dVar18 + dVar31;
              dStack_6208 = (dVar18 - (dStack_6200 - (dStack_6200 - dVar18))) +
                            (dVar31 - (dStack_6200 - dVar18));
              iStack_6578 = 4;
              iVar11 = fast_expansion_sum_zeroelim(4,&dStack_61f8,4,&dStack_6218,adStack_6038);
              dVar30 = dVar20 * dVar19;
              dVar22 = dStack_6278 * dVar28 -
                       (((dVar30 - dVar39 * dStack_6288) - dStack_6288 * dVar28) -
                       dVar39 * dStack_6278);
              dVar39 = dVar25 * dVar40;
              dVar18 = dStack_63f0 * dVar40 - (dStack_63f0 * dVar40 - dVar40);
              dVar18 = (dVar40 - dVar18) * dVar27 -
                       (((dVar39 - dVar26 * dVar18) - dVar18 * dVar27) - dVar26 * (dVar40 - dVar18))
              ;
              dVar31 = dVar22 - dVar18;
              dStack_6348 = (dVar22 - (dVar31 + (dVar22 - dVar31))) + ((dVar22 - dVar31) - dVar18);
              dVar18 = dVar30 + dVar31;
              dVar30 = (dVar30 - (dVar18 - (dVar18 - dVar30))) + (dVar31 - (dVar18 - dVar30));
              dVar31 = dVar30 - dVar39;
              dStack_6340 = (dVar30 - (dVar31 + (dVar30 - dVar31))) + ((dVar30 - dVar31) - dVar39);
              dStack_6330 = dVar18 + dVar31;
              dStack_6338 = (dVar18 - (dStack_6330 - (dStack_6330 - dVar18))) +
                            (dVar31 - (dStack_6330 - dVar18));
            }
            else {
              adStack_6038[0] = 0.0;
              dStack_6348 = 0.0;
              iVar11 = 1;
              iStack_6578 = 1;
            }
            if ((dVar42 != 0.0) || (NAN(dVar42))) {
              iVar7 = scale_expansion_zeroelim(iVar7,adStack_5df8,dVar42,adStack_63e8);
              iVar12 = scale_expansion_zeroelim(iVar11,adStack_6038,dVar42,adStack_58b8);
              iVar13 = scale_expansion_zeroelim(iVar12,adStack_58b8,dVar46 + dVar46,adStack_6178);
              iVar7 = fast_expansion_sum_zeroelim
                                (iVar7,adStack_63e8,iVar13,adStack_6178,adStack_5db8);
              iVar7 = fast_expansion_sum_zeroelim
                                ((uint)pdStack_6638,pdStack_6658,iVar7,adStack_5db8,pdStack_6640);
              if ((dVar40 != 0.0) ||
                 (pdVar16 = pdStack_6640, pdStack_6638 = pdStack_6658, NAN(dVar40))) {
                iVar13 = scale_expansion_zeroelim(4,&dStack_6468,dVar42,adStack_6258);
                iVar13 = scale_expansion_zeroelim(iVar13,adStack_6258,dVar40,adStack_63e8);
                iVar7 = fast_expansion_sum_zeroelim
                                  (iVar7,pdStack_6640,iVar13,adStack_63e8,pdStack_6658);
                pdVar16 = pdStack_6658;
                pdStack_6638 = pdStack_6640;
              }
              if ((dVar19 != 0.0) || (pdStack_6640 = pdVar16, NAN(dVar19))) {
                iVar13 = scale_expansion_zeroelim(4,&dStack_6448,-dVar42,adStack_6258);
                iVar13 = scale_expansion_zeroelim(iVar13,adStack_6258,dVar19,adStack_63e8);
                iVar7 = fast_expansion_sum_zeroelim(iVar7,pdVar16,iVar13,adStack_63e8,pdStack_6638);
                pdStack_6640 = pdStack_6638;
                pdStack_6638 = pdVar16;
              }
              iVar12 = scale_expansion_zeroelim(iVar12,adStack_58b8,dVar42,adStack_6178);
              iVar13 = scale_expansion_zeroelim(iStack_6578,&dStack_6348,dVar42,adStack_59f8);
              elen = scale_expansion_zeroelim(iVar13,adStack_59f8,dVar46 + dVar46,adStack_63e8);
              iVar13 = scale_expansion_zeroelim(iVar13,adStack_59f8,dVar42,adStack_6308);
              iVar13 = fast_expansion_sum_zeroelim
                                 (elen,adStack_63e8,iVar13,adStack_6308,adStack_5c38);
              iVar12 = fast_expansion_sum_zeroelim
                                 (iVar12,adStack_6178,iVar13,adStack_5c38,adStack_53b8);
              uVar14 = fast_expansion_sum_zeroelim
                                 (iVar7,pdStack_6640,iVar12,adStack_53b8,pdStack_6638);
              pdStack_6658 = pdStack_6638;
              pdStack_6638._0_4_ = uVar14;
            }
            if ((dVar43 != 0.0) || (NAN(dVar43))) {
              iVar6 = scale_expansion_zeroelim(iVar6,adStack_5e38,dVar43,adStack_63e8);
              iVar7 = scale_expansion_zeroelim(iVar11,adStack_6038,dVar43,adStack_50b8);
              iVar11 = scale_expansion_zeroelim(iVar7,adStack_50b8,b_02 + b_02,adStack_6178);
              iVar6 = fast_expansion_sum_zeroelim
                                (iVar6,adStack_63e8,iVar11,adStack_6178,adStack_5db8);
              iVar6 = fast_expansion_sum_zeroelim
                                ((uint)pdStack_6638,pdStack_6658,iVar6,adStack_5db8,pdStack_6640);
              iVar7 = scale_expansion_zeroelim(iVar7,adStack_50b8,dVar43,adStack_6178);
              iVar11 = scale_expansion_zeroelim(iStack_6578,&dStack_6348,dVar43,adStack_5a38);
              iVar12 = scale_expansion_zeroelim(iVar11,adStack_5a38,b_02 + b_02,adStack_63e8);
              iVar11 = scale_expansion_zeroelim(iVar11,adStack_5a38,dVar43,adStack_6308);
              iVar11 = fast_expansion_sum_zeroelim
                                 (iVar12,adStack_63e8,iVar11,adStack_6308,adStack_5c38);
              iVar7 = fast_expansion_sum_zeroelim
                                (iVar7,adStack_6178,iVar11,adStack_5c38,adStack_53b8);
              pdStack_6638._0_4_ =
                   fast_expansion_sum_zeroelim(iVar6,pdStack_6640,iVar7,adStack_53b8,pdStack_6658);
            }
          }
          dVar30 = splitter;
          if (bVar1 || bVar2) {
            if ((dVar43 != 0.0 || dVar42 != 0.0) || (dVar19 != 0.0 || dVar25 != 0.0)) {
              dVar18 = dVar25 * splitter - (dVar25 * splitter - dVar25);
              dVar27 = dVar25 - dVar18;
              dVar39 = b_02 * splitter - (b_02 * splitter - b_02);
              dVar39 = (b_02 - dVar39) * dVar27 -
                       (((dVar45 - dVar18 * dVar39) - dVar39 * dVar27) - dVar18 * (b_02 - dVar39));
              dVar31 = b_00 * splitter - (b_00 * splitter - b_00);
              dVar32 = dVar43 * splitter - (dVar43 * splitter - dVar43);
              dVar33 = dVar43 - dVar32;
              dVar31 = (b_00 - dVar31) * dVar33 -
                       (((dStack_6408 - dVar31 * dVar32) - (b_00 - dVar31) * dVar32) -
                       dVar31 * dVar33);
              dVar22 = dVar39 + dVar31;
              dStack_61f8 = (dVar39 - (dVar22 - (dVar22 - dVar39))) + (dVar31 - (dVar22 - dVar39));
              dVar39 = dVar45 + dVar22;
              dVar22 = (dVar45 - (dVar39 - (dVar39 - dVar45))) + (dVar22 - (dVar39 - dVar45));
              dVar31 = dStack_6408 + dVar22;
              dStack_61f0 = (dVar22 - (dVar31 - (dVar31 - dVar22))) +
                            (dStack_6408 - (dVar31 - dVar22));
              dStack_61e0 = dVar39 + dVar31;
              dStack_61e8 = (dVar39 - (dStack_61e0 - (dStack_61e0 - dVar39))) +
                            (dVar31 - (dStack_61e0 - dVar39));
              dVar31 = -b;
              dVar39 = dVar42 * dVar31;
              dVar28 = dVar42 * splitter - (dVar42 * splitter - dVar42);
              dVar29 = dVar42 - dVar28;
              dVar22 = splitter * dVar31 - (b + splitter * dVar31);
              dVar31 = (dVar31 - dVar22) * dVar29 -
                       (((dVar39 - dVar28 * dVar22) - dVar22 * dVar29) - dVar28 * (dVar31 - dVar22))
              ;
              dVar22 = -dVar19;
              dVar23 = dVar46 * dVar22;
              dVar24 = dVar46 * splitter - (dVar46 * splitter - dVar46);
              dVar26 = splitter * dVar22 - (dVar19 + splitter * dVar22);
              dVar22 = (dVar22 - dVar26) * (dVar46 - dVar24) -
                       (((dVar23 - dVar24 * dVar26) - dVar26 * (dVar46 - dVar24)) -
                       dVar24 * (dVar22 - dVar26));
              dVar24 = dVar31 + dVar22;
              dStack_6218 = (dVar31 - (dVar24 - (dVar24 - dVar31))) + (dVar22 - (dVar24 - dVar31));
              dVar31 = dVar39 + dVar24;
              dVar39 = (dVar39 - (dVar31 - (dVar31 - dVar39))) + (dVar24 - (dVar31 - dVar39));
              dVar22 = dVar23 + dVar39;
              dStack_6210 = (dVar39 - (dVar22 - (dVar22 - dVar39))) + (dVar23 - (dVar22 - dVar39));
              dStack_6200 = dVar31 + dVar22;
              dStack_6208 = (dVar31 - (dStack_6200 - (dStack_6200 - dVar31))) +
                            (dVar22 - (dStack_6200 - dVar31));
              iStack_6578 = 4;
              iVar6 = fast_expansion_sum_zeroelim(4,&dStack_61f8,4,&dStack_6218,adStack_6078);
              dVar39 = dVar25 * dVar43;
              dVar31 = dVar33 * dVar27 -
                       (((dVar39 - dVar18 * dVar32) - dVar32 * dVar27) - dVar18 * dVar33);
              dVar18 = dVar42 * dVar19;
              dVar30 = dVar30 * dVar19 - (dVar30 * dVar19 - dVar19);
              dVar30 = (dVar19 - dVar30) * dVar29 -
                       (((dVar18 - dVar28 * dVar30) - dVar30 * dVar29) - dVar28 * (dVar19 - dVar30))
              ;
              dVar22 = dVar31 - dVar30;
              dStack_6368 = (dVar31 - (dVar22 + (dVar31 - dVar22))) + ((dVar31 - dVar22) - dVar30);
              dVar31 = dVar39 + dVar22;
              dVar30 = (dVar39 - (dVar31 - (dVar31 - dVar39))) + (dVar22 - (dVar31 - dVar39));
              dVar39 = dVar30 - dVar18;
              dStack_6360 = (dVar30 - (dVar39 + (dVar30 - dVar39))) + ((dVar30 - dVar39) - dVar18);
              dStack_6350 = dVar31 + dVar39;
              dStack_6358 = (dVar31 - (dStack_6350 - (dStack_6350 - dVar31))) +
                            (dVar39 - (dStack_6350 - dVar31));
            }
            else {
              adStack_6078[0] = 0.0;
              dStack_6368 = 0.0;
              iVar6 = 1;
              iStack_6578 = 1;
            }
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              iVar7 = scale_expansion_zeroelim(iStack_6528,adStack_5e78,dVar20,adStack_63e8);
              iVar11 = scale_expansion_zeroelim(iVar6,adStack_6078,dVar20,adStack_5938);
              iVar12 = scale_expansion_zeroelim(iVar11,adStack_5938,b_01 + b_01,adStack_6178);
              iVar7 = fast_expansion_sum_zeroelim
                                (iVar7,adStack_63e8,iVar12,adStack_6178,adStack_5db8);
              iVar7 = fast_expansion_sum_zeroelim
                                ((uint)pdStack_6638,pdStack_6658,iVar7,adStack_5db8,pdStack_6640);
              if ((dVar19 != 0.0) ||
                 (pdVar16 = pdStack_6640, pdStack_6638 = pdStack_6658, NAN(dVar19))) {
                iVar12 = scale_expansion_zeroelim(4,&dStack_6428,dVar20,adStack_6258);
                iVar12 = scale_expansion_zeroelim(iVar12,adStack_6258,dVar19,adStack_63e8);
                iVar7 = fast_expansion_sum_zeroelim
                                  (iVar7,pdStack_6640,iVar12,adStack_63e8,pdStack_6658);
                pdVar16 = pdStack_6658;
                pdStack_6638 = pdStack_6640;
              }
              if ((dVar43 != 0.0) || (pdStack_6640 = pdVar16, NAN(dVar43))) {
                iVar12 = scale_expansion_zeroelim(4,&dStack_6468,-dVar20,adStack_6258);
                iVar12 = scale_expansion_zeroelim(iVar12,adStack_6258,dVar43,adStack_63e8);
                iVar7 = fast_expansion_sum_zeroelim(iVar7,pdVar16,iVar12,adStack_63e8,pdStack_6638);
                pdStack_6640 = pdStack_6638;
                pdStack_6638 = pdVar16;
              }
              iVar11 = scale_expansion_zeroelim(iVar11,adStack_5938,dVar20,adStack_6178);
              iVar12 = scale_expansion_zeroelim(iStack_6578,&dStack_6368,dVar20,adStack_5a78);
              iVar13 = scale_expansion_zeroelim(iVar12,adStack_5a78,b_01 + b_01,adStack_63e8);
              iVar12 = scale_expansion_zeroelim(iVar12,adStack_5a78,dVar20,adStack_6308);
              iVar12 = fast_expansion_sum_zeroelim
                                 (iVar13,adStack_63e8,iVar12,adStack_6308,adStack_5c38);
              iVar11 = fast_expansion_sum_zeroelim
                                 (iVar11,adStack_6178,iVar12,adStack_5c38,adStack_53b8);
              uVar14 = fast_expansion_sum_zeroelim
                                 (iVar7,pdStack_6640,iVar11,adStack_53b8,pdStack_6638);
              pdStack_6658 = pdStack_6638;
              pdStack_6638._0_4_ = uVar14;
            }
            if ((dVar40 != 0.0) || (NAN(dVar40))) {
              iVar7 = scale_expansion_zeroelim(iVar8,adStack_5eb8,dVar40,adStack_63e8);
              iVar6 = scale_expansion_zeroelim(iVar6,adStack_6078,dVar40,adStack_5138);
              iVar8 = scale_expansion_zeroelim(iVar6,adStack_5138,dVar21 + dVar21,adStack_6178);
              iVar7 = fast_expansion_sum_zeroelim
                                (iVar7,adStack_63e8,iVar8,adStack_6178,adStack_5db8);
              iVar7 = fast_expansion_sum_zeroelim
                                ((uint)pdStack_6638,pdStack_6658,iVar7,adStack_5db8,pdStack_6640);
              iVar6 = scale_expansion_zeroelim(iVar6,adStack_5138,dVar40,adStack_6178);
              iVar8 = scale_expansion_zeroelim(iStack_6578,&dStack_6368,dVar40,adStack_5ab8);
              iVar11 = scale_expansion_zeroelim(iVar8,adStack_5ab8,dVar21 + dVar21,adStack_63e8);
              iVar8 = scale_expansion_zeroelim(iVar8,adStack_5ab8,dVar40,adStack_6308);
              iVar8 = fast_expansion_sum_zeroelim
                                (iVar11,adStack_63e8,iVar8,adStack_6308,adStack_5c38);
              iVar6 = fast_expansion_sum_zeroelim
                                (iVar6,adStack_6178,iVar8,adStack_5c38,adStack_53b8);
              pdStack_6638._0_4_ =
                   fast_expansion_sum_zeroelim(iVar7,pdStack_6640,iVar6,adStack_53b8,pdStack_6658);
            }
          }
          dVar30 = splitter;
          if (bVar5) {
            if ((dVar20 != 0.0 || dVar40 != 0.0) || (bVar3 || bVar4)) {
              dVar31 = dVar42 * splitter - (dVar42 * splitter - dVar42);
              dVar23 = dVar42 - dVar31;
              dVar39 = dVar21 * splitter - (dVar21 * splitter - dVar21);
              dVar22 = (dVar21 - dVar39) * dVar23 -
                       (((dStack_6268 - dVar31 * dVar39) - dVar39 * dVar23) -
                       dVar31 * (dVar21 - dVar39));
              dVar39 = dVar46 * splitter - (dVar46 * splitter - dVar46);
              dVar28 = dVar40 * splitter - (dVar40 * splitter - dVar40);
              dVar29 = dVar40 - dVar28;
              dVar39 = (dVar46 - dVar39) * dVar29 -
                       (((dVar47 - dVar39 * dVar28) - (dVar46 - dVar39) * dVar28) - dVar39 * dVar29)
              ;
              dVar18 = dVar22 + dVar39;
              dStack_61f8 = (dVar22 - (dVar18 - (dVar18 - dVar22))) + (dVar39 - (dVar18 - dVar22));
              dVar39 = dStack_6268 + dVar18;
              dVar46 = (dStack_6268 - (dVar39 - (dVar39 - dStack_6268))) +
                       (dVar18 - (dVar39 - dStack_6268));
              dVar18 = dVar47 + dVar46;
              dStack_61f0 = (dVar46 - (dVar18 - (dVar18 - dVar46))) + (dVar47 - (dVar18 - dVar46));
              dStack_61e0 = dVar39 + dVar18;
              dStack_61e8 = (dVar39 - (dStack_61e0 - (dStack_61e0 - dVar39))) +
                            (dVar18 - (dStack_61e0 - dVar39));
              dVar18 = -b_02;
              dVar39 = dVar20 * dVar18;
              dVar26 = dVar20 * splitter - (dVar20 * splitter - dVar20);
              dVar27 = dVar20 - dVar26;
              dVar46 = splitter * dVar18 - (b_02 + splitter * dVar18);
              dVar18 = (dVar18 - dVar46) * dVar27 -
                       (((dVar39 - dVar26 * dVar46) - dVar46 * dVar27) - dVar26 * (dVar18 - dVar46))
              ;
              dVar46 = -dVar43;
              dVar22 = b_01 * dVar46;
              dVar21 = b_01 * splitter - (b_01 * splitter - b_01);
              dVar24 = splitter * dVar46 - (dVar43 + splitter * dVar46);
              dVar46 = (dVar46 - dVar24) * (b_01 - dVar21) -
                       (((dVar22 - dVar21 * dVar24) - dVar24 * (b_01 - dVar21)) -
                       dVar21 * (dVar46 - dVar24));
              dVar21 = dVar18 + dVar46;
              dStack_6218 = (dVar18 - (dVar21 - (dVar21 - dVar18))) + (dVar46 - (dVar21 - dVar18));
              dVar18 = dVar39 + dVar21;
              dVar39 = (dVar39 - (dVar18 - (dVar18 - dVar39))) + (dVar21 - (dVar18 - dVar39));
              dVar46 = dVar22 + dVar39;
              dStack_6210 = (dVar39 - (dVar46 - (dVar46 - dVar39))) + (dVar22 - (dVar46 - dVar39));
              dStack_6200 = dVar18 + dVar46;
              dStack_6208 = (dVar18 - (dStack_6200 - (dStack_6200 - dVar18))) +
                            (dVar46 - (dStack_6200 - dVar18));
              iStack_65b8 = 4;
              iVar6 = fast_expansion_sum_zeroelim(4,&dStack_61f8,4,&dStack_6218,adStack_5ff8);
              dVar42 = dVar42 * dVar40;
              dVar18 = dVar29 * dVar23 -
                       (((dVar42 - dVar31 * dVar28) - dVar28 * dVar23) - dVar31 * dVar29);
              dVar20 = dVar20 * dVar43;
              dVar30 = dVar30 * dVar43 - (dVar30 * dVar43 - dVar43);
              dVar30 = (dVar43 - dVar30) * dVar27 -
                       (((dVar20 - dVar26 * dVar30) - dVar30 * dVar27) - dVar26 * (dVar43 - dVar30))
              ;
              dVar39 = dVar18 - dVar30;
              dStack_6328 = (dVar18 - (dVar39 + (dVar18 - dVar39))) + ((dVar18 - dVar39) - dVar30);
              dVar30 = dVar42 + dVar39;
              dVar18 = (dVar42 - (dVar30 - (dVar30 - dVar42))) + (dVar39 - (dVar30 - dVar42));
              dVar39 = dVar18 - dVar20;
              dStack_6320 = (dVar18 - (dVar39 + (dVar18 - dVar39))) + ((dVar18 - dVar39) - dVar20);
              dStack_6310 = dVar30 + dVar39;
              dStack_6318 = (dVar30 - (dStack_6310 - (dStack_6310 - dVar30))) +
                            (dVar39 - (dStack_6310 - dVar30));
            }
            else {
              adStack_5ff8[0] = 0.0;
              dStack_6328 = 0.0;
              iVar6 = 1;
              iStack_65b8 = 1;
            }
            if ((dVar25 != 0.0) || (NAN(dVar25))) {
              iVar7 = scale_expansion_zeroelim(iVar10,adStack_5ef8,dVar25,adStack_63e8);
              iVar8 = scale_expansion_zeroelim(iVar6,adStack_5ff8,dVar25,adStack_59b8);
              iVar10 = scale_expansion_zeroelim(iVar8,adStack_59b8,b_00 + b_00,adStack_6178);
              iVar7 = fast_expansion_sum_zeroelim
                                (iVar7,adStack_63e8,iVar10,adStack_6178,adStack_5db8);
              iVar7 = fast_expansion_sum_zeroelim
                                ((uint)pdStack_6638,pdStack_6658,iVar7,adStack_5db8,pdStack_6640);
              if ((dVar43 != 0.0) || (pdStack_65a8 = pdStack_6640, NAN(dVar43))) {
                iVar10 = scale_expansion_zeroelim(4,&dStack_6448,dVar25,adStack_6258);
                iVar10 = scale_expansion_zeroelim(iVar10,adStack_6258,dVar43,adStack_63e8);
                iVar7 = fast_expansion_sum_zeroelim
                                  (iVar7,pdStack_6640,iVar10,adStack_63e8,pdStack_6658);
                pdStack_65a8 = pdStack_6658;
                pdStack_6658 = pdStack_6640;
              }
              if ((dVar40 != 0.0) || (pdStack_6618 = pdStack_6658, NAN(dVar40))) {
                iVar10 = scale_expansion_zeroelim(4,&dStack_6428,-dVar25,adStack_6258);
                iVar10 = scale_expansion_zeroelim(iVar10,adStack_6258,dVar40,adStack_63e8);
                iVar7 = fast_expansion_sum_zeroelim
                                  (iVar7,pdStack_65a8,iVar10,adStack_63e8,pdStack_6658);
                pdStack_6618 = pdStack_65a8;
                pdStack_65a8 = pdStack_6658;
              }
              iVar8 = scale_expansion_zeroelim(iVar8,adStack_59b8,dVar25,adStack_6178);
              iVar10 = scale_expansion_zeroelim(iStack_65b8,&dStack_6328,dVar25,adStack_5af8);
              iVar11 = scale_expansion_zeroelim(iVar10,adStack_5af8,b_00 + b_00,adStack_63e8);
              iVar10 = scale_expansion_zeroelim(iVar10,adStack_5af8,dVar25,adStack_6308);
              iVar10 = fast_expansion_sum_zeroelim
                                 (iVar11,adStack_63e8,iVar10,adStack_6308,adStack_5c38);
              iVar8 = fast_expansion_sum_zeroelim
                                (iVar8,adStack_6178,iVar10,adStack_5c38,adStack_53b8);
              pdStack_6638._0_4_ =
                   fast_expansion_sum_zeroelim(iVar7,pdStack_65a8,iVar8,adStack_53b8,pdStack_6618);
              pdStack_6640 = pdStack_65a8;
              pdStack_6658 = pdStack_6618;
            }
            if ((dVar19 != 0.0) || (NAN(dVar19))) {
              iVar7 = scale_expansion_zeroelim(iVar9,adStack_5f38,dVar19,adStack_63e8);
              iVar6 = scale_expansion_zeroelim(iVar6,adStack_5ff8,dVar19,adStack_51b8);
              iVar8 = scale_expansion_zeroelim(iVar6,adStack_51b8,b + b,adStack_6178);
              iVar7 = fast_expansion_sum_zeroelim
                                (iVar7,adStack_63e8,iVar8,adStack_6178,adStack_5db8);
              iVar7 = fast_expansion_sum_zeroelim
                                ((uint)pdStack_6638,pdStack_6658,iVar7,adStack_5db8,pdStack_6640);
              iVar6 = scale_expansion_zeroelim(iVar6,adStack_51b8,dVar19,adStack_6178);
              iVar8 = scale_expansion_zeroelim(iStack_65b8,&dStack_6328,dVar19,adStack_5b38);
              iVar9 = scale_expansion_zeroelim(iVar8,adStack_5b38,b + b,adStack_63e8);
              iVar8 = scale_expansion_zeroelim(iVar8,adStack_5b38,dVar19,adStack_6308);
              iVar8 = fast_expansion_sum_zeroelim
                                (iVar9,adStack_63e8,iVar8,adStack_6308,adStack_5c38);
              iVar6 = fast_expansion_sum_zeroelim
                                (iVar6,adStack_6178,iVar8,adStack_5c38,adStack_53b8);
              pdStack_6638._0_4_ =
                   fast_expansion_sum_zeroelim(iVar7,pdStack_6640,iVar6,adStack_53b8,pdStack_6658);
            }
          }
          adStack_4838[0] = pdStack_6658[(long)(int)(uint)pdStack_6638 + -1];
        }
      }
    }
    return adStack_4838[0];
  }
  return dVar20;
}

Assistant:

REAL incircle(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL alift, blift, clift;
  REAL det;
  REAL permanent, errbound;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;
  alift = adx * adx + ady * ady;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;
  blift = bdx * bdx + bdy * bdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;
  clift = cdx * cdx + cdy * cdy;

  det = alift * (bdxcdy - cdxbdy)
      + blift * (cdxady - adxcdy)
      + clift * (adxbdy - bdxady);

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * alift
            + (Absolute(cdxady) + Absolute(adxcdy)) * blift
            + (Absolute(adxbdy) + Absolute(bdxady)) * clift;
  errbound = iccerrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return incircleadapt(pa, pb, pc, pd, permanent);
}